

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_main_locator_extra_block(archive_read *a,rar5 *rar)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint64_t locator_flags;
  byte local_20 [8];
  
  wVar1 = read_var(a,(uint64_t *)local_20,(uint64_t *)0x0);
  wVar2 = L'\x01';
  if (wVar1 != L'\0') {
    if (((local_20[0] & 1) != 0) &&
       (wVar1 = read_var(a,&rar->qlist_offset,(uint64_t *)0x0), wVar1 == L'\0')) {
      return L'\x01';
    }
    if (((local_20[0] & 2) != 0) &&
       (wVar1 = read_var(a,&rar->rr_offset,(uint64_t *)0x0), wVar1 == L'\0')) {
      return L'\x01';
    }
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

static int process_main_locator_extra_block(struct archive_read* a,
    struct rar5* rar)
{
	uint64_t locator_flags;

	enum LOCATOR_FLAGS {
		QLIST = 0x01, RECOVERY = 0x02,
	};

	if(!read_var(a, &locator_flags, NULL)) {
		return ARCHIVE_EOF;
	}

	if(locator_flags & QLIST) {
		if(!read_var(a, &rar->qlist_offset, NULL)) {
			return ARCHIVE_EOF;
		}

		/* qlist is not used */
	}

	if(locator_flags & RECOVERY) {
		if(!read_var(a, &rar->rr_offset, NULL)) {
			return ARCHIVE_EOF;
		}

		/* rr is not used */
	}

	return ARCHIVE_OK;
}